

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O0

void __thiscall ot::commissioner::JobManager::CancelCommand(JobManager *this)

{
  bool bVar1;
  uint uVar2;
  reference ppJVar3;
  element_type *peVar4;
  Error local_d0;
  Error local_a8;
  undefined1 local_79;
  Job *pJStack_78;
  bool condition;
  Job *job;
  iterator __end2;
  iterator __begin2;
  JobPool *__range2;
  undefined1 local_48 [8];
  Error error;
  CommissionerAppPtr commissioner;
  JobManager *this_local;
  
  std::shared_ptr<ot::commissioner::CommissionerApp>::shared_ptr
            ((shared_ptr<ot::commissioner::CommissionerApp> *)((long)&error.mMessage.field_2 + 8),
             (nullptr_t)0x0);
  Error::Error((Error *)local_48);
  __end2 = std::vector<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>::begin
                     (&this->mJobPool);
  job = (Job *)std::vector<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>::end
                         (&this->mJobPool);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<ot::commissioner::Job_**,_std::vector<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>_>
                                *)&job);
    if (!bVar1) {
      WaitForJobs(this);
      GetSelectedCommissioner
                (&local_a8,this,(CommissionerAppPtr *)((long)&error.mMessage.field_2 + 8));
      Error::operator=((Error *)local_48,&local_a8);
      Error::~Error(&local_a8);
      Error::Error(&local_d0);
      bVar1 = Error::operator==((Error *)local_48,&local_d0);
      Error::~Error(&local_d0);
      if (bVar1) {
        peVar4 = std::
                 __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)(error.mMessage.field_2._M_local_buf + 8));
        uVar2 = (*(peVar4->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])();
        if ((uVar2 & 1) == 0) {
          peVar4 = std::
                   __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)(error.mMessage.field_2._M_local_buf + 8));
          (*(peVar4->super_CommissionerHandler)._vptr_CommissionerHandler[0xd])();
        }
        else {
          peVar4 = std::
                   __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)(error.mMessage.field_2._M_local_buf + 8));
          (*(peVar4->super_CommissionerHandler)._vptr_CommissionerHandler[0xe])();
        }
      }
      Error::~Error((Error *)local_48);
      std::shared_ptr<ot::commissioner::CommissionerApp>::~shared_ptr
                ((shared_ptr<ot::commissioner::CommissionerApp> *)
                 ((long)&error.mMessage.field_2 + 8));
      return;
    }
    ppJVar3 = __gnu_cxx::
              __normal_iterator<ot::commissioner::Job_**,_std::vector<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>_>
              ::operator*(&__end2);
    pJStack_78 = *ppJVar3;
    local_79 = pJStack_78 != (Job *)0x0;
    if (!(bool)local_79) break;
    Job::Cancel(pJStack_78);
    __gnu_cxx::
    __normal_iterator<ot::commissioner::Job_**,_std::vector<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>_>
    ::operator++(&__end2);
  }
  __assert_fail("condition",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager.cpp"
                ,0x284,"void ot::commissioner::JobManager::CancelCommand()");
}

Assistant:

void JobManager::CancelCommand()
{
    CommissionerAppPtr commissioner = nullptr;
    Error              error        = ERROR_NONE;

    for (auto job : mJobPool)
    {
        ASSERT(job != nullptr);
        job->Cancel();
    }
    WaitForJobs();

    error = GetSelectedCommissioner(commissioner);
    if (error == ERROR_NONE)
    {
        if (commissioner->IsActive())
        {
            commissioner->CancelRequests();
        }
        else
        {
            commissioner->Stop();
        }
    }
}